

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
copyBinary(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  bool bVar1;
  Exception *this_00;
  iterator __first;
  size_type in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  ValueLength length;
  uint8_t h;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff78;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffff80;
  uint8_t *in_stack_ffffffffffffff88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc0;
  const_iterator in_stack_ffffffffffffffc8;
  
  bVar1 = isBinary((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x1235ad);
  if (bVar1) {
    head((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x1235f6);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x123609);
    start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x123613);
    readIntegerNonEmpty<unsigned_long>
              (in_stack_ffffffffffffff88,(ValueLength)in_stack_ffffffffffffff80);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (in_stack_ffffffffffffffb0,in_RSI);
    __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                        (in_stack_ffffffffffffff78);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              (in_stack_ffffffffffffff80,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_ffffffffffffff78);
    start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x123676);
    start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x123692);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,__first._M_current,
               (uchar *)in_stack_ffffffffffffffb0);
    return in_RDI;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception
            (this_00,(ExceptionType)((ulong)in_stack_ffffffffffffff88 >> 0x20),
             (char *)in_stack_ffffffffffffff80);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

std::vector<uint8_t> copyBinary() const {
    if (!isBinary()) {
      throw Exception(Exception::InvalidValueType, "Expecting type Binary");
    }

    uint8_t const h = head();
    VELOCYPACK_ASSERT(h >= 0xc0 && h <= 0xc7);

    std::vector<uint8_t> out;
    ValueLength length =
        readIntegerNonEmpty<ValueLength>(start() + 1, h - 0xbf);
    checkOverflow(length);
    out.reserve(static_cast<std::size_t>(length));
    out.insert(out.end(), start() + 1 + h - 0xbf,
               start() + 1 + h - 0xbf + length);
    return out;
  }